

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.h
# Opt level: O1

bool __thiscall
FIX::TimeRange::isInSameRange(TimeRange *this,UtcTimeStamp *time1,UtcTimeStamp *time2)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int64_t iVar3;
  int64_t iVar4;
  bool bVar5;
  DateTime *time2_00;
  tm tm;
  DateTime local_98;
  DateTime local_80;
  tm local_68;
  
  if (this[0x38] == (TimeRange)0x1) {
    local_98._vptr_DateTime =
         (_func_int **)
         ((time1->super_DateTime).m_time / 1000000000 +
          (long)(time1->super_DateTime).m_date * 0x15180 + -0x3118a41200);
    FIX::time_localtime((long *)&local_68);
    DateTime::fromTm(&local_80,&local_68,0);
    iVar3 = local_80.m_time;
    uVar1 = local_80._8_8_;
    local_98._vptr_DateTime =
         (_func_int **)
         ((time2->super_DateTime).m_time / 1000000000 +
          (long)(time2->super_DateTime).m_date * 0x15180 + -0x3118a41200);
    FIX::time_localtime((long *)&local_68);
    DateTime::fromTm(&local_80,&local_68,0);
    iVar4 = local_80.m_time;
    uVar2 = local_80._8_8_;
    local_98.m_date = local_80.m_date;
    local_98._12_4_ = local_80._12_4_;
    local_98.m_time = local_80.m_time;
    local_80.m_date = (int)uVar1;
    local_80._12_4_ = SUB84(uVar1,4);
    local_68.tm_hour = local_80.m_date;
    local_68.tm_mday = local_80._12_4_;
    local_80.m_time._0_4_ = (undefined4)iVar3;
    local_80.m_time._4_4_ = SUB84(iVar3,4);
    local_68.tm_mon = (undefined4)local_80.m_time;
    local_68.tm_year = local_80.m_time._4_4_;
    local_98._vptr_DateTime = (_func_int **)&PTR__DateTime_00327fd0;
    time2_00 = &local_98;
    local_80._8_8_ = uVar2;
    local_80.m_time = iVar4;
  }
  else {
    local_68.tm_hour = (time1->super_DateTime).m_date;
    local_68.tm_mday = *(int *)&(time1->super_DateTime).field_0xc;
    local_68._16_8_ = (time1->super_DateTime).m_time;
    time2_00 = &local_80;
    local_80._vptr_DateTime = (_func_int **)&PTR__DateTime_00327fd0;
    local_80.m_date = (time2->super_DateTime).m_date;
    local_80._12_4_ = *(undefined4 *)&(time2->super_DateTime).field_0xc;
    local_80.m_time = (time2->super_DateTime).m_time;
  }
  local_68._0_8_ = &PTR__DateTime_00327fd0;
  bVar5 = isInSameRange(this,(DateTime *)&local_68,time2_00);
  return bVar5;
}

Assistant:

bool isInSameRange(const UtcTimeStamp &time1, const UtcTimeStamp &time2) {
    if (m_useLocalTime) {
      LocalTimeStamp localTime1(time1.getTimeT());
      LocalTimeStamp localTime2(time2.getTimeT());
      return isInSameRange((DateTime)localTime1, (DateTime)localTime2);
    }

    return isInSameRange((DateTime)time1, (DateTime)time2);
  }